

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
__thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<MyGame::Example::Referrable>
          (FlatBufferBuilderImpl<false> *this,Offset<MyGame::Example::Referrable> *v,size_t len)

{
  uint _o;
  size_t local_30;
  size_t i;
  size_t len_local;
  Offset<MyGame::Example::Referrable> *v_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  StartVector<flatbuffers::Offset<MyGame::Example::Referrable>,flatbuffers::Offset,unsigned_int>
            (this,len);
  local_30 = len;
  while (local_30 != 0) {
    PushElement<MyGame::Example::Referrable,flatbuffers::Offset>
              (this,(Offset<MyGame::Example::Referrable>)v[local_30 - 1].o);
    local_30 = local_30 - 1;
  }
  _o = EndVector<unsigned_int,unsigned_int>(this,len);
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>::
  Offset((Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          *)((long)&this_local + 4),_o);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          )this_local._4_4_;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVector(const Offset<T> *v, size_t len) {
    StartVector<Offset<T>>(len);
    for (auto i = len; i > 0;) { PushElement(v[--i]); }
    return Offset<Vector<Offset<T>>>(EndVector(len));
  }